

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O0

void __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::AddVar
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,double lb,double ub,Type type
          )

{
  Type in_ESI;
  Argument1 in_RDI;
  TestProblemBuilder *this_00;
  undefined1 local_41 [17];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  double local_18;
  double local_10 [2];
  
  internal::Unused<double,double,mp::var::Type>(local_10,&local_18,(Type *)&stack0xffffffffffffffe4)
  ;
  this_00 = (TestProblemBuilder *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  TestProblemBuilder::ReportUnhandledConstruct(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  return;
}

Assistant:

void AddVar(double lb, double ub, var::Type type) {
    internal::Unused(lb, ub, type);
    MP_DISPATCH(ReportUnhandledConstruct("variable"));
  }